

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_Vk.cpp
# Opt level: O0

void __thiscall
Diligent::SerializedPipelineStateImpl::PatchShadersVk<Diligent::TilePipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,TilePipelineStateCreateInfo *CreateInfo)

{
  bool bVar1;
  uint uVar2;
  Uint32 UVar3;
  size_type sVar4;
  value_type *pvVar5;
  reference pvVar6;
  reference pvVar7;
  PipelineResourceSignatureVkImpl *pPVar8;
  PipelineResourceSignatureDesc *pPVar9;
  Char *pCVar10;
  reference pvVar11;
  const_iterator pDVar12;
  pointer pSignatures;
  reference this_00;
  value_type *pvVar13;
  value_type *pvVar14;
  reference ppSVar15;
  ShaderCreateInfo *__src;
  char (*Args_1) [50];
  TBindIndexToDescSetIndex *BindIndexToDescSetIndex_00;
  uint *local_2a8;
  ShaderMacroArray local_278;
  undefined1 local_268 [8];
  ShaderCreateInfo ShaderCI;
  value_type *SPIRV;
  size_t i_2;
  value_type *Stage;
  size_t j;
  string msg_2;
  undefined1 local_188 [7];
  bool bStripReflection;
  string msg_1;
  DESCRIPTOR_SET_ID SetId;
  const_iterator __end3;
  const_iterator __begin3;
  undefined8 local_148;
  initializer_list<Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID> local_140;
  initializer_list<Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID> *local_130;
  initializer_list<Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID> *__range3;
  string msg;
  value_type *pSignature;
  Uint32 i_1;
  Uint32 DescSetLayoutCount;
  TBindIndexToDescSetIndex BindIndexToDescSetIndex;
  SignatureArray<PipelineResourceSignatureVkImpl> Signatures;
  IPipelineResourceSignature *DefaultSignatures [1];
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *pRStack_88;
  Uint32 SignaturesCount;
  IPipelineResourceSignature **ppSignatures;
  value_type *Dst;
  value_type *Src;
  size_t i;
  undefined1 local_60 [8];
  TShaderStages ShaderStagesVk;
  SHADER_TYPE local_34;
  undefined1 local_30 [3];
  bool WaitUntilShadersReady;
  SHADER_TYPE ActiveShaderStages;
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ShaderStages;
  TilePipelineStateCreateInfo *CreateInfo_local;
  SerializedPipelineStateImpl *this_local;
  
  ShaderStages.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CreateInfo;
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ::vector((vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
            *)local_30);
  local_34 = SHADER_TYPE_UNKNOWN;
  PipelineStateUtils::
  ExtractShaders<Diligent::SerializedShaderImpl,std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>>>
            ((TilePipelineStateCreateInfo *)
             ShaderStages.
             super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
              *)local_30,true,&local_34);
  sVar4 = std::
          vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
          ::size((vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                  *)local_30);
  std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>::allocator
            ((allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo> *)((long)&i + 7));
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::vector((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
            *)local_60,sVar4,
           (allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo> *)((long)&i + 7));
  std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>::~allocator
            ((allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo> *)((long)&i + 7));
  for (Src = (value_type *)0x0;
      pvVar5 = (value_type *)
               std::
               vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
               ::size((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                       *)local_60), Src < pvVar5;
      Src = (value_type *)((long)&(Src->super_ShaderStageInfo).Type + 1)) {
    pvVar6 = std::
             vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
             ::operator[]((vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                           *)local_30,(size_type)Src);
    pvVar7 = std::
             vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             ::operator[]((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                           *)local_60,(size_type)Src);
    pvVar7->Type = (pvVar6->super_ShaderStageInfo).Type;
    std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
    operator=(&pvVar7->Shaders,&(pvVar6->super_ShaderStageInfo).Shaders);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator=(&pvVar7->SPIRVs,&(pvVar6->super_ShaderStageInfo).SPIRVs);
  }
  pRStack_88 = (RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)
               ((ShaderStages.
                 super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->Serialized).
               super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  DefaultSignatures[0]._4_4_ =
       *(Uint32 *)
        ((long)&((ShaderStages.
                  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->Serialized).
                super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                ._M_impl.super__Vector_impl_data._M_finish + 4);
  memset(Signatures._M_elems + 7,0,8);
  if (*(int *)((long)&((ShaderStages.
                        super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->Serialized).
                      super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 4) == 0) {
    CreateDefaultResourceSignature<Diligent::PipelineStateVkImpl,Diligent::PipelineResourceSignatureVkImpl,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
              (this,Vulkan,
               (PipelineStateDesc *)
               ShaderStages.
               super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_34,
               (vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                *)local_60);
    Signatures._M_elems[7].m_pObject =
         (PipelineResourceSignatureVkImpl *)
         Diligent::RefCntAutoPtr::operator_cast_to_SerializedResourceSignatureImpl_
                   ((RefCntAutoPtr *)&this->m_pDefaultSignature);
    DefaultSignatures[0]._4_4_ = 1;
    pRStack_88 = Signatures._M_elems + 7;
  }
  memset(BindIndexToDescSetIndex._M_elems + 6,0,0x40);
  local_2a8 = BindIndexToDescSetIndex._M_elems + 6;
  do {
    RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)local_2a8);
    local_2a8 = local_2a8 + 2;
  } while ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)local_2a8 !=
           Signatures._M_elems + 7);
  Args_1 = (char (*) [50])((long)DefaultSignatures + 4);
  anon_unknown_60::SortResourceSignatures<Diligent::PipelineResourceSignatureVkImpl>
            ((IPipelineResourceSignature **)pRStack_88,DefaultSignatures[0]._4_4_,
             (SignatureArray<Diligent::PipelineResourceSignatureVkImpl> *)
             (BindIndexToDescSetIndex._M_elems + 6),(Uint32 *)Args_1);
  memset(&i_1,0,0x20);
  pSignature._4_4_ = 0;
  for (pSignature._0_4_ = 0; (uint)pSignature < DefaultSignatures[0]._4_4_;
      pSignature._0_4_ = (uint)pSignature + 1) {
    msg.field_2._8_8_ =
         std::array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>,_8UL>::
         operator[]((array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>,_8UL>
                     *)(BindIndexToDescSetIndex._M_elems + 6),(ulong)(uint)pSignature);
    pPVar8 = Diligent::RefCntAutoPtr::operator_cast_to_PipelineResourceSignatureVkImpl_
                       ((RefCntAutoPtr *)msg.field_2._8_8_);
    if (pPVar8 != (PipelineResourceSignatureVkImpl *)0x0) {
      pPVar8 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator->
                         ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)
                          msg.field_2._8_8_);
      pPVar9 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          *)pPVar8);
      if (pPVar9->BindingIndex != (uint)pSignature) {
        FormatString<char[26],char[40]>
                  ((string *)&__range3,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pSignature->GetDesc().BindingIndex == i",(char (*) [40])Args_1);
        pCVar10 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar10,"PatchShadersVk",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
                   ,0xa4);
        std::__cxx11::string::~string((string *)&__range3);
      }
      uVar2 = StaticCast<unsigned_int,unsigned_int>((uint *)((long)&pSignature + 4));
      pvVar11 = std::array<unsigned_int,_8UL>::operator[]
                          ((array<unsigned_int,_8UL> *)&i_1,(ulong)(uint)pSignature);
      Args_1 = (char (*) [50])(ulong)uVar2;
      *pvVar11 = uVar2;
      __begin3 = (const_iterator)0x0;
      local_148 = 1;
      local_140._M_array = (iterator)&__begin3;
      local_140._M_len = 2;
      local_130 = &local_140;
      __end3 = std::initializer_list<Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID>::
               begin(local_130);
      pDVar12 = std::initializer_list<Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID>
                ::end(local_130);
      for (; __end3 != pDVar12; __end3 = __end3 + 1) {
        msg_1.field_2._8_8_ = *__end3;
        pPVar8 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator->
                           ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)
                            msg.field_2._8_8_);
        UVar3 = PipelineResourceSignatureVkImpl::GetDescriptorSetSize(pPVar8,msg_1.field_2._8_8_);
        if (UVar3 != 0xffffffff) {
          pSignature._4_4_ = pSignature._4_4_ + 1;
        }
      }
    }
  }
  if (0x10 < pSignature._4_4_) {
    FormatString<char[26],char[50]>
              ((string *)local_188,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2",Args_1);
    pCVar10 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar10,"PatchShadersVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
               ,0xad);
    std::__cxx11::string::~string((string *)local_188);
  }
  msg_2.field_2._M_local_buf[0xf] = (this->m_Data).Aux.NoShaderReflection & 1;
  pSignatures = std::array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>,_8UL>
                ::data((array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>,_8UL>
                        *)(BindIndexToDescSetIndex._M_elems + 6));
  BindIndexToDescSetIndex_00 = (TBindIndexToDescSetIndex *)&i_1;
  PipelineStateVkImpl::RemapOrVerifyShaderResources
            ((TShaderStages *)local_60,pSignatures,DefaultSignatures[0]._4_4_,
             BindIndexToDescSetIndex_00,false,(bool)(msg_2.field_2._M_local_buf[0xf] & 1),
             *(char **)&(ShaderStages.
                         super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_ShaderStageInfo,
             (TShaderResources *)0x0,(TResourceAttibutions *)0x0);
  std::array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>,_8UL>::~array
            ((array<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>,_8UL> *)
             (BindIndexToDescSetIndex._M_elems + 6));
  this_00 = std::
            array<std::vector<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>,_7UL>
            ::operator[](&(this->m_Data).Shaders,3);
  bVar1 = std::
          vector<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
          ::empty(this_00);
  if (!bVar1) {
    FormatString<char[26],char[64]>
              ((string *)&j,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Data.Shaders[static_cast<size_t>(DeviceType::Vulkan)].empty()",
               (char (*) [64])BindIndexToDescSetIndex_00);
    pCVar10 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar10,"PatchShadersVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
               ,0xb9);
    std::__cxx11::string::~string((string *)&j);
  }
  for (Stage = (value_type *)0x0;
      pvVar13 = (value_type *)
                std::
                vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                ::size((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                        *)local_60), Stage < pvVar13; Stage = (value_type *)((long)&Stage->Type + 1)
      ) {
    pvVar7 = std::
             vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             ::operator[]((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                           *)local_60,(size_type)Stage);
    for (SPIRV = (value_type *)0x0;
        pvVar14 = (value_type *)PipelineStateVkImpl::ShaderStageInfo::Count(pvVar7), SPIRV < pvVar14
        ; SPIRV = (value_type *)
                  ((long)&(SPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_start + 1)) {
      ShaderCI.WebGPUEmulatedArrayIndexSuffix =
           (char *)std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[](&pvVar7->SPIRVs,(size_type)SPIRV);
      pvVar6 = std::
               vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               ::operator[]((vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                             *)local_30,(size_type)Stage);
      ppSVar15 = std::
                 vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                 ::operator[](&pvVar6->Serialized,(size_type)SPIRV);
      __src = SerializedShaderImpl::GetCreateInfo(*ppSVar15);
      memcpy((ShaderCreateInfo *)local_268,__src,0x98);
      ShaderCI.pShaderSourceStreamFactory = (IShaderSourceInputStreamFactory *)0x0;
      local_268 = (undefined1  [8])0x0;
      ShaderMacroArray::ShaderMacroArray(&local_278);
      ShaderCI.Macros.Elements._0_4_ = local_278.Count;
      ShaderCI.EntryPoint = (Char *)local_278.Elements;
      ShaderCI.Source =
           (Char *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              ShaderCI.WebGPUEmulatedArrayIndexSuffix);
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         ShaderCI.WebGPUEmulatedArrayIndexSuffix);
      ShaderCI.ByteCode = (void *)(sVar4 << 2);
      SerializeShaderCreateInfo(this,Vulkan,(ShaderCreateInfo *)local_268);
    }
  }
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::~vector((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             *)local_60);
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ::~vector((vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
             *)local_30);
  return;
}

Assistant:

void SerializedPipelineStateImpl::PatchShadersVk(const CreateInfoType& CreateInfo) noexcept(false)
{
    std::vector<ShaderStageInfoVk> ShaderStages;
    SHADER_TYPE                    ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
    constexpr bool                 WaitUntilShadersReady = true;
    PipelineStateUtils::ExtractShaders<SerializedShaderImpl>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

    PipelineStateVkImpl::TShaderStages ShaderStagesVk{ShaderStages.size()};
    for (size_t i = 0; i < ShaderStagesVk.size(); ++i)
    {
        auto& Src   = ShaderStages[i];
        auto& Dst   = ShaderStagesVk[i];
        Dst.Type    = Src.Type;
        Dst.Shaders = std::move(Src.Shaders);
        Dst.SPIRVs  = std::move(Src.SPIRVs);
    }

    auto** ppSignatures    = CreateInfo.ppResourceSignatures;
    auto   SignaturesCount = CreateInfo.ResourceSignaturesCount;

    IPipelineResourceSignature* DefaultSignatures[1] = {};
    if (CreateInfo.ResourceSignaturesCount == 0)
    {
        CreateDefaultResourceSignature<PipelineStateVkImpl, PipelineResourceSignatureVkImpl>(DeviceType::Vulkan, CreateInfo.PSODesc, ActiveShaderStages, ShaderStagesVk);

        DefaultSignatures[0] = m_pDefaultSignature;
        SignaturesCount      = 1;
        ppSignatures         = DefaultSignatures;
    }

    {
        // Sort signatures by binding index.
        // Note that SignaturesCount will be overwritten with the maximum binding index.
        SignatureArray<PipelineResourceSignatureVkImpl> Signatures = {};
        SortResourceSignatures(ppSignatures, SignaturesCount, Signatures, SignaturesCount);

        // Same as PipelineLayoutVk::Create()
        PipelineStateVkImpl::TBindIndexToDescSetIndex BindIndexToDescSetIndex = {};
        Uint32                                        DescSetLayoutCount      = 0;
        for (Uint32 i = 0; i < SignaturesCount; ++i)
        {
            const auto& pSignature = Signatures[i];
            if (pSignature == nullptr)
                continue;

            VERIFY_EXPR(pSignature->GetDesc().BindingIndex == i);
            BindIndexToDescSetIndex[i] = StaticCast<PipelineStateVkImpl::TBindIndexToDescSetIndex::value_type>(DescSetLayoutCount);

            for (auto SetId : {PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE, PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC})
            {
                if (pSignature->GetDescriptorSetSize(SetId) != ~0u)
                    ++DescSetLayoutCount;
            }
        }
        VERIFY_EXPR(DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2);

        const auto bStripReflection = m_Data.Aux.NoShaderReflection;
        PipelineStateVkImpl::RemapOrVerifyShaderResources(ShaderStagesVk,
                                                          Signatures.data(),
                                                          SignaturesCount,
                                                          BindIndexToDescSetIndex,
                                                          false, // bVerifyOnly
                                                          bStripReflection,
                                                          CreateInfo.PSODesc.Name);
    }

    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::Vulkan)].empty());
    for (size_t j = 0; j < ShaderStagesVk.size(); ++j)
    {
        const auto& Stage = ShaderStagesVk[j];
        for (size_t i = 0; i < Stage.Count(); ++i)
        {
            const auto& SPIRV     = Stage.SPIRVs[i];
            auto        ShaderCI  = ShaderStages[j].Serialized[i]->GetCreateInfo();
            ShaderCI.Source       = nullptr;
            ShaderCI.FilePath     = nullptr;
            ShaderCI.Macros       = {};
            ShaderCI.ByteCode     = SPIRV.data();
            ShaderCI.ByteCodeSize = SPIRV.size() * sizeof(SPIRV[0]);
            SerializeShaderCreateInfo(DeviceType::Vulkan, ShaderCI);
        }
    }
}